

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O3

void __thiscall TidyConfigParser::parseChecks(TidyConfigParser *this)

{
  char cVar1;
  char cVar2;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  int iVar3;
  undefined8 extraout_RAX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  bool bVar4;
  int unaff_R15D;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string checkGroup;
  string checkName;
  CheckStatus local_bc;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  TidyConfig *local_38;
  
  local_38 = &this->config;
  while( true ) {
    if (((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) != 0) {
      return;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    cVar1 = nextChar(this);
    while (cVar1 == '\n') {
      cVar1 = nextChar(this);
    }
    if (cVar1 != '-') break;
    local_bc = DISABLED;
LAB_001a4322:
    cVar2 = nextChar(this);
    if (cVar2 != '*') {
      if (cVar2 != '-') {
        unaff_R15D = (int)cVar2;
        iVar3 = isalpha(unaff_R15D);
        if (iVar3 != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_78,cVar2);
          while (cVar2 = nextChar(this), cVar2 != '-') {
            unaff_R15D = (int)cVar2;
            iVar3 = isalpha(unaff_R15D);
            if (iVar3 == 0) {
              local_98._M_dataplus._M_p._0_4_ = unaff_R15D;
              args.field_1.values_ = in_R9.values_;
              args.desc_ = (unsigned_long_long)&local_98;
              fmt.size_ = 0x81;
              fmt.data_ = (char *)0x2a;
              local_98.field_2._M_local_buf[0] = cVar2;
              ::fmt::v11::vformat_abi_cxx11_
                        (&local_b8,(v11 *)"Expected \'-\' or a letter but found: ({}){}",fmt,args);
              reportErrorAndExit(this,&local_b8);
              goto LAB_001a4662;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(&local_78,cVar2);
          }
          goto LAB_001a433e;
        }
        goto LAB_001a46c5;
      }
LAB_001a433e:
      bVar4 = false;
      cVar2 = cVar1;
      while( true ) {
        while (cVar1 = nextChar(this), cVar1 == '*') {
          cVar1 = cVar2;
          if (local_58._M_string_length != 0) goto LAB_001a4697;
          bVar4 = true;
          toggleAllGroupChecks(this,&local_78,local_bc);
        }
        unaff_R15D = (int)cVar1;
        if (cVar1 == ',') {
          toggleCheck(this,&local_78,&local_58,local_bc);
          cVar2 = nextChar(this);
          if (cVar2 != '\n') goto LAB_001a4662;
          goto LAB_001a45d3;
        }
        iVar3 = isalpha(unaff_R15D);
        if ((cVar1 != '-') && (iVar3 == 0)) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_58,cVar1);
        cVar2 = cVar1;
      }
      if ((cVar1 == '\n') || (cVar1 == '\0')) {
        while( true ) {
          while ((iVar3 = std::istream::peek(), iVar3 == 0x20 ||
                 (iVar3 = std::istream::peek(), iVar3 == 9))) {
            std::istream::get();
          }
          if ((((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) != 0) ||
             (cVar1 = std::istream::peek(), cVar1 != '\n')) break;
          nextChar(this);
        }
        if (!bVar4) {
          toggleCheck(this,&local_78,&local_58,local_bc);
        }
        goto LAB_001a452e;
      }
      goto LAB_001a475b;
    }
    if (local_78._M_string_length != 0) goto LAB_001a46f9;
    TidyConfig::toggleAl(local_38,DISABLED);
    cVar1 = nextChar(this);
    if (cVar1 != '\0') {
      if (cVar1 == ',') {
LAB_001a45d3:
        bVar4 = false;
        goto LAB_001a45d5;
      }
      if (cVar1 == '\n') goto LAB_001a4411;
      goto LAB_001a478f;
    }
LAB_001a4411:
    while( true ) {
      while ((iVar3 = std::istream::peek(), iVar3 == 0x20 ||
             (iVar3 = std::istream::peek(), iVar3 == 9))) {
        std::istream::get();
      }
      if ((((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) != 0) ||
         (cVar1 = std::istream::peek(), cVar1 != '\n')) break;
      nextChar(this);
    }
LAB_001a452e:
    this->parserState = Initial;
    bVar4 = true;
LAB_001a45d5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if (bVar4) {
      return;
    }
  }
  unaff_R15D = (int)cVar1;
  iVar3 = isalpha(unaff_R15D);
  if (iVar3 != 0) {
    local_bc = ENABLED;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_78,cVar1);
    goto LAB_001a4322;
  }
  if (cVar1 != '*') goto LAB_001a4727;
  TidyConfig::toggleAl(local_38,ENABLED);
  cVar1 = nextChar(this);
  if (cVar1 == '\0') {
LAB_001a4573:
    while( true ) {
      while ((iVar3 = std::istream::peek(), iVar3 == 0x20 ||
             (iVar3 = std::istream::peek(), iVar3 == 9))) {
        std::istream::get();
      }
      if ((((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) != 0) ||
         (cVar1 = std::istream::peek(), cVar1 != '\n')) break;
      nextChar(this);
    }
    goto LAB_001a452e;
  }
  if (cVar1 == ',') {
    cVar1 = nextChar(this);
    if (cVar1 != '\n') goto LAB_001a47fd;
    goto LAB_001a45d3;
  }
  if (cVar1 == '\n') goto LAB_001a4573;
LAB_001a47c6:
  local_98._M_dataplus._M_p._0_4_ = (int)cVar1;
  args_05.field_1.values_ = in_R9.values_;
  args_05.desc_ = (unsigned_long_long)&local_98;
  fmt_05.size_ = 0x81;
  fmt_05.data_ = (char *)0x1e;
  local_98.field_2._M_local_buf[0] = cVar1;
  ::fmt::v11::vformat_abi_cxx11_(&local_b8,(v11 *)"Expected \',\' but found: ({}){}",fmt_05,args_05)
  ;
  reportErrorAndExit(this,&local_b8);
  cVar1 = extraout_AL_01;
LAB_001a47fd:
  local_98._M_dataplus._M_p._0_4_ = (int)cVar1;
  args_06.field_1.values_ = in_R9.values_;
  args_06.desc_ = (unsigned_long_long)&local_98;
  fmt_06.size_ = 0x81;
  fmt_06.data_ = (char *)0x23;
  local_98.field_2._M_local_buf[0] = cVar1;
  ::fmt::v11::vformat_abi_cxx11_
            (&local_b8,(v11 *)"Expected new line but found: ({}){}",fmt_06,args_06);
  reportErrorAndExit(this,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(extraout_RAX);
LAB_001a4662:
  local_98._M_dataplus._M_p._0_4_ = unaff_R15D;
  local_98.field_2._M_local_buf[0] = ',';
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)&local_98;
  fmt_00.size_ = 0x81;
  fmt_00.data_ = (char *)0x23;
  ::fmt::v11::vformat_abi_cxx11_
            (&local_b8,(v11 *)"Expected new line but found: ({}){}",fmt_00,args_00);
  reportErrorAndExit(this,&local_b8);
LAB_001a4697:
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Unexpected \'*\'","");
  reportErrorAndExit(this,&local_98);
LAB_001a46c5:
  local_98._M_dataplus._M_p._0_4_ = unaff_R15D;
  local_98.field_2._M_local_buf[0] = (char)unaff_R15D;
  args_01.field_1.args_ = in_R9.args_;
  args_01.desc_ = (unsigned_long_long)&local_98;
  fmt_01.size_ = 0x81;
  fmt_01.data_ = (char *)0x2a;
  ::fmt::v11::vformat_abi_cxx11_
            (&local_b8,(v11 *)"Expected \'*\' or a letter but found: ({}){}",fmt_01,args_01);
  reportErrorAndExit(this,&local_b8);
LAB_001a46f9:
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Unexpected \'*\'","");
  reportErrorAndExit(this,&local_98);
LAB_001a4727:
  local_98.field_2._M_local_buf[0] = cVar1;
  local_98._M_dataplus._M_p._0_4_ = unaff_R15D;
  args_02.field_1.values_ = in_R9.values_;
  args_02.desc_ = (unsigned_long_long)&local_98;
  fmt_02.size_ = 0x81;
  fmt_02.data_ = (char *)0x31;
  ::fmt::v11::vformat_abi_cxx11_
            (&local_b8,(v11 *)"Expected \'-\' or \'*\' or a letter but found: ({}){}",fmt_02,args_02
            );
  reportErrorAndExit(this,&local_b8);
LAB_001a475b:
  local_98._M_dataplus._M_p._0_4_ = unaff_R15D;
  local_98.field_2._M_local_buf[0] = (char)unaff_R15D;
  args_03.field_1.values_ = in_R9.values_;
  args_03.desc_ = (unsigned_long_long)&local_98;
  fmt_03.size_ = 0x81;
  fmt_03.data_ = (char *)0x11;
  ::fmt::v11::vformat_abi_cxx11_(&local_b8,(v11 *)"Unexpected ({}){}",fmt_03,args_03);
  reportErrorAndExit(this,&local_b8);
  cVar1 = extraout_AL;
LAB_001a478f:
  local_98._M_dataplus._M_p._0_4_ = (int)cVar1;
  args_04.field_1.values_ = in_R9.values_;
  args_04.desc_ = (unsigned_long_long)&local_98;
  fmt_04.size_ = 0x81;
  fmt_04.data_ = (char *)0x1e;
  local_98.field_2._M_local_buf[0] = cVar1;
  ::fmt::v11::vformat_abi_cxx11_(&local_b8,(v11 *)"Expected \',\' but found: ({}){}",fmt_04,args_04)
  ;
  reportErrorAndExit(this,&local_b8);
  cVar1 = extraout_AL_00;
  goto LAB_001a47c6;
}

Assistant:

void TidyConfigParser::parseChecks() {
    while (!fileStream.eof()) {
        TidyConfig::CheckStatus newCheckState = TidyConfig::CheckStatus::ENABLED;
        bool checkGroupParsed = false;
        bool ruleParsed = false;
        std::string checkGroup;
        std::string checkName;

        // Get the first char
        char currentChar = nextChar();

        // If it is a new line ignore it and get the following char
        while (currentChar == '\n')
            currentChar = nextChar();

        if (currentChar == '-')
            newCheckState = TidyConfig::CheckStatus::DISABLED;
        else if (isalpha(currentChar))
            checkGroup.push_back(currentChar);
        else if (currentChar == '*') {
            toggleAllChecks(TidyConfig::CheckStatus::ENABLED);
            currentChar = nextChar();
            if (currentChar == '\n' || currentChar == 0) {
                while (peekChar() == '\n')
                    nextChar();
                parserState = TidyConfigParser::ParserState::Initial;
                return;
            }
            else if (currentChar == ',') {
                currentChar = nextChar();
                if (currentChar != '\n') {
                    reportErrorAndExit(fmt::format("Expected new line but found: ({}){}",
                                                   +currentChar, currentChar));
                }
                continue;
            }
            else {
                reportErrorAndExit(
                    fmt::format("Expected ',' but found: ({}){}", +currentChar, currentChar));
            }
        }
        else {
            reportErrorAndExit(fmt::format("Expected '-' or '*' or a letter but found: ({}){}",
                                           +currentChar, currentChar));
        }

        // Parse second char
        currentChar = nextChar();

        if (currentChar == '*') {
            if (checkGroup.size())
                reportErrorAndExit("Unexpected '*'");
            ruleParsed = true;
            toggleAllChecks(TidyConfig::CheckStatus::DISABLED);
        }
        else if (currentChar == '-')
            checkGroupParsed = true;
        else if (isalpha(currentChar))
            checkGroup.push_back(currentChar);
        else {
            reportErrorAndExit(fmt::format("Expected '*' or a letter but found: ({}){}",
                                           +currentChar, currentChar));
        }

        if (ruleParsed) {
            currentChar = nextChar();
            if (currentChar == '\n' || currentChar == 0) {
                while (peekChar() == '\n')
                    nextChar();
                parserState = TidyConfigParser::ParserState::Initial;
                return;
            }
            else if (currentChar != ',') {
                reportErrorAndExit(
                    fmt::format("Expected ',' but found: ({}){}", +currentChar, currentChar));
            }
            continue;
        }

        // Parse group name
        while (!checkGroupParsed) {
            currentChar = nextChar();
            if (currentChar == '-')
                checkGroupParsed = true;
            else if (isalpha(currentChar))
                checkGroup.push_back(currentChar);
            else {
                reportErrorAndExit(fmt::format("Expected '-' or a letter but found: ({}){}",
                                               +currentChar, currentChar));
            }
        }

        // Parse check name
        bool checkParsed = false;
        while (true) {
            currentChar = nextChar();
            if (currentChar == ',') {
                toggleCheck(checkGroup, checkName, newCheckState);
                if (nextChar() != '\n') {
                    reportErrorAndExit(fmt::format("Expected new line but found: ({}){}",
                                                   +currentChar, currentChar));
                }
                break;
            }
            else if (currentChar == '*') {
                if (checkName.size())
                    reportErrorAndExit("Unexpected '*'");
                toggleAllGroupChecks(checkGroup, newCheckState);
                checkParsed = true;
            }
            else if (isalpha(currentChar) || currentChar == '-') {
                checkName.push_back(currentChar);
            }
            else if (currentChar == '\n' || currentChar == 0) {
                while (peekChar() == '\n')
                    nextChar();
                if (!checkParsed)
                    toggleCheck(checkGroup, checkName, newCheckState);
                parserState = ParserState::Initial;
                return;
            }
            else {
                reportErrorAndExit(fmt::format("Unexpected ({}){}", +currentChar, currentChar));
            }
        }
    }
}